

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void show_seg_usage(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int local_28;
  int ram_base;
  int rom_free;
  int rom_used;
  int nb;
  int stop;
  int start;
  int addr;
  int j;
  int i;
  
  uVar3 = machine->ram_base;
  printf("segment usage:\n");
  printf("\n");
  if (max_bank != 0) {
    printf("\t\t\t\t    USED/FREE\n");
  }
  if (max_zp < 2) {
    printf("      ZP    -\n");
  }
  else {
    uVar2 = uVar3 + max_zp + -1;
    printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n",(ulong)uVar3,(ulong)uVar2,
           (ulong)((uVar2 - uVar3) + 1),(ulong)((uVar2 - uVar3) + 1),
           (ulong)(0x100 - ((uVar2 - uVar3) + 1)));
  }
  if (max_bss < 0x202) {
    printf("     BSS    -\n");
  }
  else {
    uVar2 = uVar3 + 0x200;
    uVar3 = uVar3 + max_bss + -1;
    printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n",(ulong)uVar2,(ulong)uVar3,
           (ulong)((uVar3 - uVar2) + 1),(ulong)((uVar3 - uVar2) + 1),
           (ulong)(0x2000 - ((uVar3 - uVar2) + 1)));
  }
  ram_base = 0;
  local_28 = 0;
  for (addr = 0; addr <= max_bank; addr = addr + 1) {
    stop = 0;
    rom_free = 0;
    for (start = 0; start < 0x2000; start = start + 1) {
      if (map[addr][start] != 0xff) {
        rom_free = rom_free + 1;
      }
    }
    ram_base = rom_free + ram_base;
    local_28 = (0x2000 - rom_free) + local_28;
    if (rom_free == 0) {
      printf("BANK %2X  %-23s       0/8192\n",(ulong)(uint)addr,bank_name + addr);
    }
    else {
      printf("BANK %2X  %-23s    %4i/%4i\n",(ulong)(uint)addr,bank_name + addr,(ulong)(uint)rom_free
             ,(ulong)(0x2000 - rom_free));
      if (dump_seg != 1) {
        while( true ) {
          for (; (iVar1 = stop, stop < 0x2000 && (map[addr][stop] == 0xff)); stop = stop + 1) {
          }
          if (0x1fff < stop) break;
          section = map[addr][stop] & 0xf;
          page = (map[addr][stop] & 0xe0) * 0x100;
          while ((stop < 0x2000 && ((map[addr][stop] & 0xf) == section))) {
            stop = stop + 1;
          }
          printf("    %s    $%04X-$%04X  [%4i]\n",section_name + section,(ulong)(uint)(iVar1 + page)
                 ,(ulong)((stop + page) - 1),(ulong)(uint)(stop - iVar1));
        }
      }
    }
  }
  uVar3 = ram_base + 0x3ff >> 10;
  printf("\t\t\t\t    ---- ----\n");
  printf("\t\t\t\t    %4iK%4iK\n",(ulong)uVar3,(ulong)(uint)(local_28 >> 10));
  printf("\n\t\t\tTOTAL SIZE =     %4iK\n",(ulong)(uVar3 + (local_28 >> 10)));
  return;
}

Assistant:

void
show_seg_usage(void)
{
	int i, j;
	int addr, start, stop, nb;
	int rom_used;
	int rom_free;
	int ram_base = machine->ram_base;

	printf("segment usage:\n");
	printf("\n");

	if (max_bank)
		printf("\t\t\t\t    USED/FREE\n");

	/* zp usage */
	if (max_zp <= 1)
		printf("      ZP    -\n");
	else {
		start = ram_base;
		stop  = ram_base + (max_zp - 1);
		printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n", start, stop, stop - start + 1, stop-start+1, 256-(stop-start+1));
	}

	/* bss usage */
	if (max_bss <= 0x201)
		printf("     BSS    -\n");
	else {
		start = ram_base + 0x200;
		stop  = ram_base + (max_bss - 1);
		printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n", start, stop, stop - start + 1, stop-start+1, 8192-(stop-start+1));
	}

	/* bank usage */
	rom_used = 0;
	rom_free = 0;

	/* scan banks */
	for (i = 0; i <= max_bank; i++) {
		start = 0;
		addr = 0;
		nb = 0;

		/* count used and free bytes */
		for (j = 0; j < 8192; j++)
			if (map[i][j] != 0xFF)
				nb++;

		/* update used/free counters */
		rom_used += nb;
		rom_free += 8192 - nb;

		/* display bank infos */
		if (nb)
			printf("BANK %2X  %-23s    %4i/%4i\n",
					i, bank_name[i], nb, 8192 - nb);
		else {
			printf("BANK %2X  %-23s       0/8192\n", i, bank_name[i]);
			continue;
		}

		/* scan */
		if (dump_seg == 1)
			continue;

		for (;;) {
			/* search section start */
			for (; addr < 8192; addr++)
				if (map[i][addr] != 0xFF)
					break;

			/* check for end of bank */
			if (addr > 8191)
				break;

			/* get section type */
			section = map[i][addr] & 0x0F;
			page = (map[i][addr] & 0xE0) << 8;
			start = addr;

			/* search section end */
			for (; addr < 8192; addr++)
				if ((map[i][addr] & 0x0F) != section)
					break;

			/* display section infos */
			printf("    %s    $%04X-$%04X  [%4i]\n",
					section_name[section],	/* section name */
				    start + page,			/* starting address */
					addr  + page - 1,		/* end address */
					addr  - start);			/* size */
		}
	}

	/* total */
	rom_used = (rom_used + 1023) >> 10;
	rom_free = (rom_free) >> 10;
	printf("\t\t\t\t    ---- ----\n");
	printf("\t\t\t\t    %4iK%4iK\n", rom_used, rom_free);
	printf("\n\t\t\tTOTAL SIZE =     %4iK\n", (rom_used + rom_free));
}